

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O1

unique_ptr<wallet::DatabaseCursor,_std::default_delete<wallet::DatabaseCursor>_> __thiscall
wallet::SQLiteBatch::GetNewCursor(SQLiteBatch *this)

{
  long lVar1;
  int iVar2;
  _func_int **pp_Var3;
  runtime_error *this_00;
  long in_RSI;
  char **args_1;
  long in_FS_OFFSET;
  char local_50 [8];
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(in_RSI + 8);
  if (*(long *)(lVar1 + 200) == 0) {
    (this->super_DatabaseBatch)._vptr_DatabaseBatch = (_func_int **)0x0;
    pp_Var3 = (_func_int **)0x0;
  }
  else {
    pp_Var3 = (_func_int **)operator_new(0x40);
    *pp_Var3 = (_func_int *)0x0;
    pp_Var3[1] = (_func_int *)0x0;
    pp_Var3[6] = (_func_int *)0x0;
    pp_Var3[7] = (_func_int *)0x0;
    pp_Var3[4] = (_func_int *)0x0;
    pp_Var3[5] = (_func_int *)0x0;
    pp_Var3[2] = (_func_int *)0x0;
    pp_Var3[3] = (_func_int *)0x0;
    *pp_Var3 = (_func_int *)&PTR__SQLiteCursor_013e1b40;
    pp_Var3[5] = (_func_int *)0x0;
    pp_Var3[6] = (_func_int *)0x0;
    pp_Var3[3] = (_func_int *)0x0;
    pp_Var3[4] = (_func_int *)0x0;
    pp_Var3[1] = (_func_int *)0x0;
    pp_Var3[2] = (_func_int *)0x0;
    pp_Var3[7] = (_func_int *)0x0;
    args_1 = (char **)0x0;
    iVar2 = sqlite3_prepare_v2(*(undefined8 *)(lVar1 + 200),"SELECT key, value FROM main",0xffffffff
                               ,pp_Var3 + 1);
    if (iVar2 != 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_50 = (char  [8])sqlite3_errstr(iVar2);
      tinyformat::format<char[13],char_const*>
                (&local_48,(tinyformat *)"%s: Failed to setup cursor SQL statement: %s\n",
                 "GetNewCursor",(char (*) [13])local_50,args_1);
      std::runtime_error::runtime_error(this_00,(string *)&local_48);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_00c8fd76;
    }
  }
  (this->super_DatabaseBatch)._vptr_DatabaseBatch = pp_Var3;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (__uniq_ptr_data<wallet::DatabaseCursor,_std::default_delete<wallet::DatabaseCursor>,_true,_true>
            )(__uniq_ptr_data<wallet::DatabaseCursor,_std::default_delete<wallet::DatabaseCursor>,_true,_true>
              )this;
  }
LAB_00c8fd76:
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<DatabaseCursor> SQLiteBatch::GetNewCursor()
{
    if (!m_database.m_db) return nullptr;
    auto cursor = std::make_unique<SQLiteCursor>();

    const char* stmt_text = "SELECT key, value FROM main";
    int res = sqlite3_prepare_v2(m_database.m_db, stmt_text, -1, &cursor->m_cursor_stmt, nullptr);
    if (res != SQLITE_OK) {
        throw std::runtime_error(strprintf(
            "%s: Failed to setup cursor SQL statement: %s\n", __func__, sqlite3_errstr(res)));
    }

    return cursor;
}